

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_time_warping.cc
# Opt level: O2

void __thiscall
sptk::DynamicTimeWarping::DynamicTimeWarping
          (DynamicTimeWarping *this,int num_order,LocalPathConstraints param_2,
          DistanceMetrics distance_metric)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  LocalPathConstraints LVar1;
  pointer ppVar2;
  pointer pdVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int local_28 [2];
  
  this->_vptr_DynamicTimeWarping = (_func_int **)&PTR__DynamicTimeWarping_00113ca0;
  this->num_order_ = num_order;
  this->local_path_constraint_ = param_2;
  DistanceCalculation::DistanceCalculation(&this->distance_calculation_,num_order,distance_metric);
  LVar1 = this->local_path_constraint_;
  this->includes_skip_transition_ = (LVar1 & ~kType2) == kType4;
  this->is_valid_ = true;
  (this->local_path_candidates_).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_path_candidates_).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_path_candidates_).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->local_path_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_path_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_path_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((this->num_order_ < 0) || ((this->distance_calculation_).is_valid_ != true)) ||
     (kType6 < LVar1)) {
    this->is_valid_ = false;
  }
  else {
    this_00 = &this->local_path_candidates_;
    switch(LVar1) {
    case kType0:
      local_28[0] = 0;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 1;
      local_28[1] = 0;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      break;
    case kType1:
      local_28[0] = 0;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 1;
      local_28[1] = 0;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 1;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      break;
    case kType2:
      local_28[0] = 0;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 1;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      break;
    case kType3:
      local_28[0] = 0;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 1;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 2;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      break;
    case kType4:
      local_28[0] = 0;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 1;
      local_28[1] = 0;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 1;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      break;
    case kType5:
      local_28[0] = 1;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 2;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 1;
      local_28[1] = 2;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      break;
    case kType6:
      local_28[0] = 0;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 1;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
      local_28[0] = 2;
      local_28[1] = 1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this_00,
                 local_28 + 1,local_28);
    }
    uVar6 = (ulong)((long)(this->local_path_candidates_).
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->local_path_candidates_).
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    iVar5 = (int)uVar6;
    std::vector<double,_std::allocator<double>_>::resize(&this->local_path_weights_,(long)iVar5);
    ppVar2 = (this_00->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    pdVar3 = (this->local_path_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar4 = 0;
    uVar6 = uVar6 & 0xffffffff;
    if (iVar5 < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      pdVar3[uVar4] = (double)(ppVar2[uVar4].second + ppVar2[uVar4].first);
    }
  }
  return;
}

Assistant:

DynamicTimeWarping::DynamicTimeWarping(
    int num_order, LocalPathConstraints local_path_constraint,
    DistanceCalculation::DistanceMetrics distance_metric)
    : num_order_(num_order),
      local_path_constraint_(local_path_constraint),
      distance_calculation_(num_order_, distance_metric),
      includes_skip_transition_((kType4 == local_path_constraint_ ||
                                 kType6 == local_path_constraint_)),
      is_valid_(true) {
  if (num_order_ < 0 || !distance_calculation_.IsValid()) {
    is_valid_ = false;
    return;
  }

  switch (local_path_constraint_) {
    case kType0: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(0, 1);
      break;
    }
    case kType1: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(0, 1);
      local_path_candidates_.emplace_back(1, 1);
      break;
    }
    case kType2: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(1, 1);
      break;
    }
    case kType3: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(1, 1);
      local_path_candidates_.emplace_back(1, 2);
      break;
    }
    case kType4: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(0, 1);
      local_path_candidates_.emplace_back(1, 1);
      break;
    }
    case kType5: {
      local_path_candidates_.emplace_back(1, 1);
      local_path_candidates_.emplace_back(1, 2);
      local_path_candidates_.emplace_back(2, 1);
      break;
    }
    case kType6: {
      local_path_candidates_.emplace_back(1, 0);
      local_path_candidates_.emplace_back(1, 1);
      local_path_candidates_.emplace_back(1, 2);
      break;
    }
    default: {
      is_valid_ = false;
      return;
    }
  }

  const int num_candidate(static_cast<int>(local_path_candidates_.size()));
  local_path_weights_.resize(num_candidate);
  for (int k(0); k < num_candidate; ++k) {
    local_path_weights_[k] =
        local_path_candidates_[k].first + local_path_candidates_[k].second;
  }
}